

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testUtilFunctions(DOMTest *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  XMLByte *pXVar8;
  long lVar9;
  size_t sVar10;
  XMLCh *pXVar11;
  TranscodeToStr local_3b0 [32];
  XMLByte *local_390;
  char *bytes2;
  XMLCh xmlStr2 [12];
  TranscodeToStr local_368 [32];
  XMLByte *local_348;
  char *bytes;
  XMLCh xmlStr [7];
  XMLByte *local_310;
  char *uc4;
  TranscodeFromStr local_300 [4];
  XMLCh uc3 [2];
  XMLCh *local_2e0;
  XMLCh *uc2;
  XMLByte *local_2b8;
  char *uc;
  TranscodeFromStr local_2a8 [4];
  XMLCh uval [2];
  XMLCh *local_288;
  XMLCh *ac2;
  XMLByte *local_260;
  char *ac;
  TranscodeFromStr local_250 [4];
  XMLCh aval [2];
  XMLCh *local_230;
  XMLCh *empty2;
  XMLByte *local_208;
  char *empty;
  char *utf8;
  CMStateSet setT4;
  CMStateSet setT3;
  CMStateSetEnumerator enumT2c;
  CMStateSetEnumerator enumT2b;
  CMStateSetEnumerator enumT2a;
  XMLSize_t count;
  CMStateSetEnumerator enumT2;
  CMStateSet setT2;
  CMStateSetEnumerator enumT;
  undefined1 local_108 [8];
  CMStateSet setT;
  XMLCh buffer [100];
  XMLCh XStack_16;
  XMLCh two [3];
  XMLCh one [2];
  bool OK;
  DOMTest *this_local;
  
  two[1]._1_1_ = 1;
  unique0x100021bc = this;
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1655);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1657);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1659);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x165b);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1661);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1664);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" x yz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1667);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("\rx yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x166a);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x166e);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1670);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1672);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1674);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1676);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x1678);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Boolean expression test failed at line %i\n",0x167a);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1680);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1683);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1686);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x168b);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x168e);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1691);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x1694);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x169a);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x169d);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a0);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a3);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a6);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x16a9);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar2 = xercesc_4_0::XMLString::equals(tempStr,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"String expression test failed at line %i\n",0x16ac);
    two[1]._1_1_ = 0;
  }
  XVar6 = xercesc_4_0::XMLString::stringLen((XMLCh *)0x0);
  if (XVar6 != 0) {
    fprintf(_stderr,"strLen test failed at line %i\n",0x16b0);
    two[1]._1_1_ = 0;
  }
  XVar6 = xercesc_4_0::XMLString::stringLen((XMLCh *)&xercesc_4_0::XMLUni::fgZeroLenString);
  if (XVar6 != 0) {
    fprintf(_stderr,"strLen test failed at line %i\n",0x16b5);
    two[1]._1_1_ = 0;
  }
  _XStack_16 = 0x41;
  XVar6 = xercesc_4_0::XMLString::stringLen(&XStack_16);
  if (XVar6 != 1) {
    fprintf(_stderr,"strLen test failed at line %i\n",0x16bb);
    two[1]._1_1_ = 0;
  }
  buffer[0x62] = L'A';
  buffer[99] = L'B';
  XVar6 = xercesc_4_0::XMLString::stringLen(buffer + 0x62);
  if (XVar6 != 2) {
    fprintf(_stderr,"strLen test failed at line %i\n",0x16c1);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uVar5 = xercesc_4_0::XMLString::copyNString((wchar16 *)&setT.fDynamicBuffer,tempStr,100);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16ca);
    two[1]._1_1_ = 0;
  }
  uVar5 = xercesc_4_0::XMLString::copyNString((wchar16 *)&setT.fDynamicBuffer,tempStr,3);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16cf);
    two[1]._1_1_ = 0;
  }
  uVar5 = xercesc_4_0::XMLString::copyNString((wchar16 *)&setT.fDynamicBuffer,tempStr,2);
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16d4);
    two[1]._1_1_ = 0;
  }
  uVar5 = xercesc_4_0::XMLString::copyNString((wchar16 *)&setT.fDynamicBuffer,tempStr,4);
  if ((uVar5 & 1) == 0) {
    fprintf(_stderr,"copyNString test failed at line %i\n",0x16d9);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  iVar3 = xercesc_4_0::XMLString::indexOf(tempStr,L'1');
  if (iVar3 != 0) {
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16e1);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::indexOf(tempStr,L'5');
  if (iVar3 != 4) {
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16e6);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::indexOf(tempStr,L'0');
  if (iVar3 != 9) {
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16eb);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::indexOf(tempStr,L'A');
  if (iVar3 != -1) {
    fprintf(_stderr,"indexOf test failed at line %i\n",0x16f0);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  iVar3 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'1');
  if (iVar3 != 0) {
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x16f8);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'5');
  if (iVar3 != 4) {
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x16fd);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'0');
  if (iVar3 != 9) {
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x1702);
    two[1]._1_1_ = 0;
  }
  iVar3 = xercesc_4_0::XMLString::lastIndexOf(tempStr,L'A');
  if (iVar3 != -1) {
    fprintf(_stderr,"lastIndexOf test failed at line %i\n",0x1707);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSet::CMStateSet
            ((CMStateSet *)local_108,0x3c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)local_108,8);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)local_108,0x34);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)local_108,0x22);
  bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)local_108,8);
  if (((!bVar2) || (bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)local_108,0x34), !bVar2))
     || (bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)local_108,0x22), !bVar2)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1713);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
            ((CMStateSetEnumerator *)&setT2.fDynamicBuffer,(CMStateSet *)local_108,0);
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&setT2.fDynamicBuffer);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&setT2.fDynamicBuffer), uVar4 != 8)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x171a);
    two[1]._1_1_ = 0;
  }
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&setT2.fDynamicBuffer);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&setT2.fDynamicBuffer), uVar4 != 0x22)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x171f);
    two[1]._1_1_ = 0;
  }
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&setT2.fDynamicBuffer);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&setT2.fDynamicBuffer), uVar4 != 0x34)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1724);
    two[1]._1_1_ = 0;
  }
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&setT2.fDynamicBuffer);
  if (bVar2) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1729);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSet::CMStateSet
            ((CMStateSet *)&enumT2.fLastValue,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x1ff);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x200);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x201);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x3ff);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x800);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0x9ff);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0xa00);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0xa01);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&enumT2.fLastValue,0xbff);
  bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)&enumT2.fLastValue,0);
  if (((!bVar2) ||
      (bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)&enumT2.fLastValue,0x3ff), !bVar2)) ||
     (bVar2 = xercesc_4_0::CMStateSet::getBit((CMStateSet *)&enumT2.fLastValue,0xa01), !bVar2)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x173d);
    two[1]._1_1_ = 0;
  }
  XVar6 = xercesc_4_0::CMStateSet::getBitCountInRange((CMStateSet *)&enumT2.fLastValue,0,0xc00);
  if (XVar6 != 10) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1743);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
            ((CMStateSetEnumerator *)&count,(CMStateSet *)&enumT2.fLastValue,0);
  enumT2a.fLastValue = 0;
  enumT2a._20_4_ = 0;
  while (bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements((CMStateSetEnumerator *)&count),
        bVar2) {
    enumT2a._16_8_ = enumT2a._16_8_ + 1;
    xercesc_4_0::CMStateSetEnumerator::nextElement((CMStateSetEnumerator *)&count);
  }
  if (enumT2a._16_8_ != 10) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x174f);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
            ((CMStateSetEnumerator *)&enumT2b.fLastValue,(CMStateSet *)&enumT2.fLastValue,0x200);
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&enumT2b.fLastValue);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&enumT2b.fLastValue), uVar4 != 0x200)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1757);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
            ((CMStateSetEnumerator *)&enumT2c.fLastValue,(CMStateSet *)&enumT2.fLastValue,0x202);
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&enumT2c.fLastValue);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&enumT2c.fLastValue), uVar4 != 0x3ff)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x175d);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
            ((CMStateSetEnumerator *)&setT3.fDynamicBuffer,(CMStateSet *)&enumT2.fLastValue,0x800);
  bVar2 = xercesc_4_0::CMStateSetEnumerator::hasMoreElements
                    ((CMStateSetEnumerator *)&setT3.fDynamicBuffer);
  if ((!bVar2) ||
     (uVar4 = xercesc_4_0::CMStateSetEnumerator::nextElement
                        ((CMStateSetEnumerator *)&setT3.fDynamicBuffer), uVar4 != 0x800)) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x1763);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::CMStateSet::CMStateSet
            ((CMStateSet *)&setT4.fDynamicBuffer,0xc00,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::CMStateSet
            ((CMStateSet *)&utf8,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&setT4.fDynamicBuffer,0);
  xercesc_4_0::CMStateSet::setBit((CMStateSet *)&utf8,0x400);
  XVar6 = xercesc_4_0::CMStateSet::hashCode((CMStateSet *)&setT4.fDynamicBuffer);
  XVar7 = xercesc_4_0::CMStateSet::hashCode((CMStateSet *)&utf8);
  if (XVar6 == XVar7) {
    fprintf(_stderr,"bitset test failed at line %i\n",0x176e);
    two[1]._1_1_ = 0;
  }
  empty = "UTF-8";
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            ((TranscodeToStr *)&empty2,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt((TranscodeToStr *)&empty2);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&empty2);
  local_208 = pXVar8;
  lVar9 = xercesc_4_0::XMLString::stringLen((char *)pXVar8);
  if (lVar9 != 0) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1778);
    two[1]._1_1_ = 0;
  }
  pXVar8 = local_208;
  sVar10 = strlen((char *)local_208);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            (local_250,pXVar8,sVar10,empty,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt(local_250);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr(local_250);
  local_230 = pXVar11;
  XVar6 = xercesc_4_0::XMLString::stringLen(pXVar11);
  if (XVar6 != 0) {
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x177e);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_230,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  ac._4_4_ = 0x41;
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            ((TranscodeToStr *)&ac2,(wchar16 *)((long)&ac + 4),empty,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt((TranscodeToStr *)&ac2);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&ac2);
  local_260 = pXVar8;
  bVar2 = xercesc_4_0::XMLString::equals((char *)pXVar8,"A");
  if (!bVar2) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1788);
    two[1]._1_1_ = 0;
  }
  pXVar8 = local_260;
  sVar10 = strlen((char *)local_260);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            (local_2a8,pXVar8,sVar10,empty,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt(local_2a8);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr(local_2a8);
  local_288 = pXVar11;
  bVar2 = xercesc_4_0::XMLString::equals(pXVar11,(XMLCh *)((long)&ac + 4));
  if (!bVar2) {
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x178e);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_260,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_288,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uc._4_4_ = 0x254b;
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            ((TranscodeToStr *)&uc2,(wchar16 *)((long)&uc + 4),empty,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt((TranscodeToStr *)&uc2);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr((TranscodeToStr *)&uc2);
  local_2b8 = pXVar8;
  bVar2 = xercesc_4_0::XMLString::equals((char *)pXVar8,anon_var_dwarf_3648);
  if (!bVar2) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x1797);
    two[1]._1_1_ = 0;
  }
  pXVar8 = local_2b8;
  sVar10 = strlen((char *)local_2b8);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            (local_300,pXVar8,sVar10,empty,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar11 = xercesc_4_0::TranscodeFromStr::adopt(local_300);
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr(local_300);
  local_2e0 = pXVar11;
  bVar2 = xercesc_4_0::XMLString::equals(pXVar11,(XMLCh *)((long)&uc + 4));
  if (!bVar2) {
    fprintf(_stderr,"TranscodeFromStr failed at line %i\n",0x179d);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_2b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_2e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  uc4._4_4_ = 0x6b65;
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            ((TranscodeToStr *)(xmlStr + 4),(wchar16 *)((long)&uc4 + 4),empty,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt((TranscodeToStr *)(xmlStr + 4));
  xercesc_4_0::TranscodeToStr::~TranscodeToStr((TranscodeToStr *)(xmlStr + 4));
  local_310 = pXVar8;
  bVar2 = xercesc_4_0::XMLString::equals((char *)pXVar8,anon_var_dwarf_3654);
  if (!bVar2) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17a7);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_310,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xmlStr[0] = L'検';
  xmlStr[1] = L'索';
  xmlStr[2] = L'\0';
  bytes._0_6_ = 0x8fbc308a7d5e;
  bytes._6_2_ = 0x307f;
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_368,(wchar16 *)&bytes,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt(local_368);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_368);
  local_348 = pXVar8;
  bVar2 = xercesc_4_0::XMLString::equals((char *)pXVar8,anon_var_dwarf_3660);
  if (!bVar2) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17b2);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bytes2 = (char *)0x9020523656fd4e2d;
  builtin_memcpy(xmlStr2,L" / 中國製造",0x10);
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (local_3b0,(wchar16 *)&bytes2,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pXVar8 = xercesc_4_0::TranscodeToStr::adopt(local_3b0);
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(local_3b0);
  local_390 = pXVar8;
  bVar2 = xercesc_4_0::XMLString::equals((char *)pXVar8,anon_var_dwarf_3678);
  if (!bVar2) {
    fprintf(_stderr,"TranscodeToStr failed at line %i\n",0x17be);
    two[1]._1_1_ = 0;
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_390,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar1 = two[1]._1_1_;
  xercesc_4_0::CMStateSet::~CMStateSet((CMStateSet *)&utf8);
  xercesc_4_0::CMStateSet::~CMStateSet((CMStateSet *)&setT4.fDynamicBuffer);
  xercesc_4_0::CMStateSet::~CMStateSet((CMStateSet *)&enumT2.fLastValue);
  xercesc_4_0::CMStateSet::~CMStateSet((CMStateSet *)local_108);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DOMTest::testUtilFunctions()
{
    bool OK = true;
    // test isWSReplaced
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));

    // test replaceWS
    XMLString::transcode(" x yz ", tempStr2, 3999);
    XMLString::transcode(" x yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x yz\n", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rx yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test isWSCollapsed
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("xyz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x yz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x  yz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));

    // test collapseWS
    XMLString::transcode("x yz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test removeWS
    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    if(XMLString::stringLen((XMLCh*)0)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::stringLen(XMLUni::fgZeroLenString)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh one[2]={ chLatin_A, chNull };
    if(XMLString::stringLen(one)!=1)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh two[3]={ chLatin_A, chLatin_B, chNull };
    if(XMLString::stringLen(two)!=2)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test copyNString
    XMLCh buffer[100];
    XMLString::transcode("xyz", tempStr, 3999);
    if(!XMLString::copyNString(buffer, tempStr, 100))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 3))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::copyNString(buffer, tempStr, 2))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 4))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test indexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::indexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test lastIndexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::lastIndexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the cached bit storage
    CMStateSet setT(60);
    setT.setBit(8);
    setT.setBit(52);
    setT.setBit(34);

    if(!setT.getBit(8) || !setT.getBit(52) || !setT.getBit(34))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    CMStateSetEnumerator enumT(&setT);
    if(!enumT.hasMoreElements() || enumT.nextElement()!=8)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=34)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=52)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(enumT.hasMoreElements())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the dynamic bit storage
    CMStateSet setT2(3 * CMSTATE_BITFIELD_CHUNK);
    setT2.setBit(0); // first block, begin
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 -1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 +1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK-1); // first block, end
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK); // last block, begin
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 -1); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1); // last block, middle
    setT2.setBit(3*CMSTATE_BITFIELD_CHUNK-1); // last block, end

    // test just a few ones
    if(!setT2.getBit(0) || !setT2.getBit(CMSTATE_BITFIELD_CHUNK-1) || !setT2.getBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    if(setT2.getBitCountInRange(0, 3*CMSTATE_BITFIELD_CHUNK)!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2(&setT2);
    XMLSize_t count=0;
    while(enumT2.hasMoreElements())
    {
        count++;
        enumT2.nextElement();
    }
    if(count!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test the enumerator with a non-default start
    CMStateSetEnumerator enumT2a(&setT2, CMSTATE_BITFIELD_CHUNK/2);
    if(!enumT2a.hasMoreElements() || enumT2a.nextElement()!= (CMSTATE_BITFIELD_CHUNK/2))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2b(&setT2, CMSTATE_BITFIELD_CHUNK/2+2);
    if(!enumT2b.hasMoreElements() || enumT2b.nextElement()!= (CMSTATE_BITFIELD_CHUNK-1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2c(&setT2, 2*CMSTATE_BITFIELD_CHUNK);
    if(!enumT2c.hasMoreElements() || enumT2c.nextElement()!= (2*CMSTATE_BITFIELD_CHUNK))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the hash generator
    CMStateSet setT3(3 * CMSTATE_BITFIELD_CHUNK), setT4(3 * CMSTATE_BITFIELD_CHUNK);
    // these two sets will have a single bit set at the beginning of a chunk
    setT3.setBit(0);
    setT4.setBit(CMSTATE_BITFIELD_CHUNK);
    if(setT3.hashCode()==setT4.hashCode())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

	// TranscodeFrom/ToStr

	const char* utf8 = "UTF-8";
	char* empty = (char*)TranscodeToStr(XMLUni::fgZeroLenString,utf8).adopt(); 
	if(XMLString::stringLen(empty)!=0)
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* empty2 = TranscodeFromStr((XMLByte*)empty,strlen(empty),utf8).adopt(); 
	if(XMLString::stringLen(empty2)!=0)
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&empty);
	XMLString::release(&empty2);

	const XMLCh aval [] = { 0x0041, 0x0000}; //LATIN CAPITAL LETTER A
	char* ac = (char*)TranscodeToStr(aval,utf8).adopt(); 
	if(!XMLString::equals(ac, "A"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* ac2=TranscodeFromStr((XMLByte*)ac, strlen(ac), utf8).adopt();
	if(!XMLString::equals(ac2, aval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&ac);
	XMLString::release(&ac2);
	const XMLCh uval [] = { 0x254B, 0x0000}; //BOX DRAWINGS HEAVY VERTICAL AND HORIZONTAL (needs 3 bytes for utf-8)
	char* uc = (char*)TranscodeToStr(uval,utf8).adopt(); 
	if(!XMLString::equals(uc, "\xE2\x95\x8B"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* uc2=TranscodeFromStr((XMLByte*)uc, strlen(uc), utf8).adopt();
	if(!XMLString::equals(uc2, uval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc);
	XMLString::release(&uc2);

	XMLCh uc3[] = { 0x6B65, 0 }; // Unicode Han Character 'step, pace; walk, stroll' (U+6B65); UTF-8 = 0xE6 0xAD 0xA5 (e6ada5)
	char* uc4 = (char*)TranscodeToStr(uc3, utf8).adopt();
	if(!XMLString::equals(uc4, "\xE6\xAD\xA5"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc4);

	// Input:                    U+7D5E U+308A U+8FBC U+307F U+691C U+7D22
	// Expected byte sequence:   E7 B5 9E E3 82 8A E8 BE BC E3 81 BF E6 A4 9C E7 B4 A2
	const XMLCh xmlStr [] = { 0x7D5E, 0x308A, 0x8FBC, 0x307F, 0x691C, 0x7D22, 0x0000};
	char* bytes = (char*)TranscodeToStr(xmlStr, "UTF-8").adopt();
	if(!XMLString::equals(bytes, "\xE7\xB5\x9E\xE3\x82\x8A\xE8\xBE\xBC\xE3\x81\xBF\xE6\xA4\x9C\xE7\xB4\xA2"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&bytes);

    // XERCESC-2052
    // Input:                    U+4E2D U+56FD U+5236 U+9020 U+4E2D U+570B U+88FD U+9020
    // Expected byte sequence:   E4 B8 AD E5 9B BD E5 88 B6 E9 80 A0 20 2F 20 E4 B8 AD E5 9C 8B E8 A3 BD E9 80 A0
    const XMLCh xmlStr2[] = { 0x4E2D, 0x56FD, 0x5236, 0x9020, 0x20, 0x2F, 0x20, 0x4E2D, 0x570B, 0x88FD, 0x9020, 0x0000 };
    char* bytes2 = (char*)TranscodeToStr(xmlStr2, "UTF-8").adopt();
    if (!XMLString::equals(bytes2, "\xE4\xB8\xAD\xE5\x9B\xBD\xE5\x88\xB6\xE9\x80\xA0\x20\x2F\x20\xE4\xB8\xAD\xE5\x9C\x8B\xE8\xA3\xBD\xE9\x80\xA0"))
    {
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLString::release(&bytes2);

    return OK;
}